

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O1

Element * __thiscall
Rml::Element::InsertBefore(Element *this,ElementPtr *child,Element *adjacent_element)

{
  Element **ppEVar1;
  pointer puVar2;
  code *pcVar3;
  bool bVar4;
  Element *stacking_context_parent;
  Element *this_00;
  Element *pEVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  Element *pEVar10;
  _Head_base<0UL,_Rml::Element_*,_false> local_30;
  
  if (((child->_M_t).super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
       super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
       super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl == (Element *)0x0) &&
     (bVar4 = Assert("RMLUI_ASSERT(child)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Element.cpp"
                     ,0x551), !bVar4)) {
    pcVar3 = (code *)invalidInstructionException();
    (*pcVar3)();
  }
  if (adjacent_element != (Element *)0x0) {
    puVar2 = (this->children).
             super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar6 = (long)(this->children).
                  super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2;
    if (lVar6 != 0) {
      lVar6 = lVar6 >> 3;
      lVar6 = lVar6 + (ulong)(lVar6 == 0);
      lVar8 = 0;
      do {
        bVar4 = (_Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>)
                puVar2[lVar8]._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>
                ._M_t == (_Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>)
                         adjacent_element;
        lVar9 = lVar8;
        if (bVar4) break;
        lVar8 = lVar8 + 1;
        lVar9 = lVar6;
      } while (lVar6 != lVar8);
      goto LAB_0021c6c8;
    }
  }
  bVar4 = false;
  lVar9 = 0;
LAB_0021c6c8:
  if (bVar4) {
    this_00 = (child->_M_t).super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
              super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
              super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl;
    if ((int)lVar9 <
        (int)((ulong)((long)(this->children).
                            super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->children).
                           super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 3) -
        this->num_non_dom_children) {
      (*(this->super_ScriptInterface).super_Releasable._vptr_Releasable[0x15])(this);
    }
    else {
      this->num_non_dom_children = this->num_non_dom_children + 1;
    }
    ::std::
    vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
    ::_M_insert_rval(&this->children,
                     (this->children).
                     super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar9,child);
    SetParent(this_00,this);
    pEVar10 = this_00;
    uVar7 = 0;
    do {
      (*(pEVar10->super_ScriptInterface).super_Releasable._vptr_Releasable[0x13])(pEVar10,this_00);
      pEVar10 = pEVar10->parent;
      pEVar5 = this;
      if (pEVar10 == (Element *)0x0) break;
      bVar4 = uVar7 < 2;
      uVar7 = uVar7 + 1;
    } while (bVar4);
    do {
      if (pEVar5->local_stacking_context != false) {
        pEVar5->stacking_context_dirty = true;
        break;
      }
      ppEVar1 = &pEVar5->parent;
      pEVar5 = *ppEVar1;
    } while (*ppEVar1 != (Element *)0x0);
    this->field_0x17 = this->field_0x17 | 2;
  }
  else {
    local_30._M_head_impl =
         (child->_M_t).super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
         super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
         super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl;
    (child->_M_t).super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
    super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
    super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl = (Element *)0x0;
    this_00 = AppendChild(this,(ElementPtr *)&local_30,true);
    if (local_30._M_head_impl != (Element *)0x0) {
      (*((local_30._M_head_impl)->super_ScriptInterface).super_Releasable._vptr_Releasable[2])();
    }
  }
  return this_00;
}

Assistant:

Element* Element::InsertBefore(ElementPtr child, Element* adjacent_element)
{
	RMLUI_ASSERT(child);
	// Find the position in the list of children of the adjacent element. If
	// it's nullptr or we can't find it, then we insert it at the end of the dom
	// children, as a dom element.
	size_t child_index = 0;
	bool found_child = false;
	if (adjacent_element)
	{
		for (child_index = 0; child_index < children.size(); child_index++)
		{
			if (children[child_index].get() == adjacent_element)
			{
				found_child = true;
				break;
			}
		}
	}

	Element* child_ptr = nullptr;

	if (found_child)
	{
		child_ptr = child.get();

		if ((int)child_index >= GetNumChildren())
			num_non_dom_children++;
		else
			DirtyLayout();

		children.insert(children.begin() + child_index, std::move(child));
		child_ptr->SetParent(this);

		Element* ancestor = child_ptr;
		for (int i = 0; i <= ChildNotifyLevels && ancestor; i++, ancestor = ancestor->GetParentNode())
			ancestor->OnChildAdd(child_ptr);

		DirtyStackingContext();
		DirtyDefinition(DirtyNodes::Self);
	}
	else
	{
		child_ptr = AppendChild(std::move(child));
	}

	return child_ptr;
}